

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

RawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::CreateDestroyAmountTransaction
          (RawTransactionResponseStruct *__return_storage_ptr__,
          CreateDestroyAmountRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
  local_f8;
  RawTransactionResponseStruct local_d8;
  
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2151:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2151:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"CreateDestroyAmountTransaction",&local_119);
  ExecuteStructApi<cfd::js::api::CreateDestroyAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            (&local_d8,(api *)request,(CreateDestroyAmountRequestStruct *)&local_118,&local_f8,in_R8
            );
  RawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct
ElementsTransactionStructApi::CreateDestroyAmountTransaction(
    const CreateDestroyAmountRequestStruct& request) {
  auto call_func = [](const CreateDestroyAmountRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;
    // Transaction作成
    ElementsAddressFactory address_factory;
    // Transaction作成
    std::vector<ConfidentialTxIn> txins;
    std::vector<ConfidentialTxOut> txouts;

    // TxInの追加
    for (const auto& txin_req : request.txins) {
      txins.emplace_back(
          Txid(txin_req.txid), txin_req.vout, txin_req.sequence);
    }

    // TxOutの追加
    Script script;
    for (const auto& txout_req : request.txouts) {
      const std::string& addr = txout_req.address;
      Amount amount(Amount::CreateBySatoshiAmount(txout_req.amount));
      ConfidentialAssetId asset(txout_req.asset);
      if (!txout_req.direct_locking_script.empty()) {
        txouts.emplace_back(
            Script(txout_req.direct_locking_script), asset,
            ConfidentialValue(amount),
            ConfidentialNonce(txout_req.direct_nonce), ByteData(), ByteData());
      } else {
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          if (txout_req.is_remove_nonce) {
            txouts.emplace_back(
                confidential_addr.GetUnblindedAddress(), asset, amount);
          } else {
            txouts.emplace_back(confidential_addr, asset, amount);
          }
        } else {
          ConfidentialTxOut txout(
              address_factory.GetAddress(addr), asset, amount);
          txout.SetNonce(ConfidentialNonce(txout_req.direct_nonce));
          txouts.emplace_back(txout);
        }
      }
    }

    // DestroyのTxOut追加
    ConfidentialTxOut destroy_txout =
        ConfidentialTxOut::CreateDestroyAmountTxOut(
            ConfidentialAssetId(request.destroy.asset),
            Amount::CreateBySatoshiAmount(request.destroy.amount));
    destroy_txout.SetNonce(ConfidentialNonce(request.destroy.direct_nonce));
    txouts.push_back(destroy_txout);

    // feeの追加
    ConfidentialTxOut txout_fee;
    auto& fee_req = request.fee;
    // amountが0のfeeは無効と判定
    if (fee_req.amount != 0) {
      txout_fee = ConfidentialTxOut(
          ConfidentialAssetId(fee_req.asset),
          Amount::CreateBySatoshiAmount(fee_req.amount));
    }

    ElementsTransactionApi api;
    ConfidentialTransactionController ctxc = api.CreateRawTransaction(
        request.version, request.locktime, txins, txouts, txout_fee);

    response.hex = ctxc.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      CreateDestroyAmountRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}